

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OnDiskFileIndex.cpp
# Opt level: O1

void __thiscall OnDiskFileIndex::generate_namecache_file(OnDiskFileIndex *this)

{
  string *args;
  long lVar1;
  source_loc loc;
  source_loc loc_00;
  logger *plVar2;
  string_view_t fmt;
  string_view_t fmt_00;
  uint64_t count;
  path __result;
  uint64_t offset;
  ofstream of;
  uint64_t local_2b0;
  _Any_data local_2a8;
  code *local_298;
  code *pcStack_290;
  path local_268;
  long local_228;
  undefined8 uStack_220;
  undefined8 local_218;
  undefined4 auStack_20c [55];
  ios_base local_130 [264];
  
  args = &this->cache_fname;
  plVar2 = spdlog::default_logger_raw();
  local_228 = 0;
  uStack_220 = 0;
  local_218 = 0;
  loc.funcname = (char *)0x0;
  loc.filename = (char *)0x0;
  loc.line = 0;
  loc._12_4_ = 0;
  fmt.size_ = 0x22;
  fmt.data_ = "Namecache {} not found, generating";
  spdlog::logger::log<std::__cxx11::string>(plVar2,loc,debug,fmt,args);
  std::ofstream::ofstream(&local_228);
  lVar1 = *(long *)(local_228 + -0x18);
  *(undefined4 *)((long)auStack_20c + lVar1) = 1;
  std::ios::clear((int)&stack0xfffffffffffffd38 + (int)lVar1 + 0xa0);
  std::experimental::filesystem::v1::__cxx11::path::
  path<std::__cxx11::string,std::experimental::filesystem::v1::__cxx11::path>(&local_268,args);
  std::experimental::filesystem::v1::__cxx11::path::path((path *)&local_2a8,&this->db_base);
  std::experimental::filesystem::v1::__cxx11::path::_M_append
            ((path *)&local_2a8,&local_268._M_pathname);
  std::ofstream::open((char *)&local_228,local_2a8._0_4_);
  std::experimental::filesystem::v1::__cxx11::path::~path((path *)&local_2a8);
  std::experimental::filesystem::v1::__cxx11::path::~path(&local_268);
  local_268._M_pathname._M_dataplus._M_p = (pointer)0x0;
  local_2b0 = 0;
  local_298 = (code *)0x0;
  pcStack_290 = (code *)0x0;
  local_2a8._M_unused._M_object = (void *)0x0;
  local_2a8._8_8_ = 0;
  local_2a8._M_unused._M_object = operator_new(0x18);
  *(long **)local_2a8._M_unused._0_8_ = &local_228;
  *(path **)((long)local_2a8._M_unused._0_8_ + 8) = &local_268;
  *(uint64_t **)((long)local_2a8._M_unused._0_8_ + 0x10) = &local_2b0;
  pcStack_290 = std::
                _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/libursa/OnDiskFileIndex.cpp:16:23)>
                ::_M_invoke;
  local_298 = std::
              _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/libursa/OnDiskFileIndex.cpp:16:23)>
              ::_M_manager;
  for_each_filename(this,(function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                          *)&local_2a8);
  if (local_298 != (code *)0x0) {
    (*local_298)(&local_2a8,&local_2a8,3);
  }
  this->file_count = local_2b0;
  std::ostream::write((char *)&local_228,(long)&local_268);
  std::ostream::flush();
  plVar2 = spdlog::default_logger_raw();
  local_2a8._M_unused._M_object = (void *)0x0;
  local_2a8._8_8_ = 0;
  local_298 = (code *)0x0;
  loc_00.funcname = (char *)0x0;
  loc_00.filename = (char *)0x0;
  loc_00.line = 0;
  loc_00._12_4_ = 0;
  fmt_00.size_ = 8;
  fmt_00.data_ = "SAVE: {}";
  spdlog::logger::log<std::__cxx11::string>(plVar2,loc_00,info,fmt_00,args);
  local_228 = _VTT;
  *(undefined8 *)((long)&local_228 + *(long *)(_VTT + -0x18)) = _seekpos;
  std::filebuf::~filebuf((filebuf *)&uStack_220);
  std::ios_base::~ios_base(local_130);
  return;
}

Assistant:

void OnDiskFileIndex::generate_namecache_file() {
    spdlog::debug("Namecache {} not found, generating", cache_fname);

    std::ofstream of;
    of.exceptions(std::ofstream::badbit);
    of.open(db_base / cache_fname, std::ofstream::binary);

    uint64_t offset = 0;
    uint64_t count = 0;
    for_each_filename([&of, &offset, &count](const std::string &fname) {
        of.write(reinterpret_cast<char *>(&offset), sizeof(offset));
        offset += fname.size() + 1;
        count += 1;
    });
    file_count = count;
    of.write(reinterpret_cast<char *>(&offset), sizeof(offset));
    of.flush();
    spdlog::info("SAVE: {}", cache_fname);
}